

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.cpp
# Opt level: O3

int __thiscall
libtorrent::alert_manager::set_alert_queue_size_limit(alert_manager *this,int queue_size_limit_)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    iVar1 = this->m_queue_size_limit;
    this->m_queue_size_limit = queue_size_limit_;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int alert_manager::set_alert_queue_size_limit(int queue_size_limit_)
	{
		std::lock_guard<std::recursive_mutex> lock(m_mutex);

		std::swap(m_queue_size_limit, queue_size_limit_);
		return queue_size_limit_;
	}